

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepTiledInputFile::DeepTiledInputFile
          (DeepTiledInputFile *this,Header *header,IStream *is,int version,int numThreads)

{
  int iVar1;
  Data *pDVar2;
  undefined4 extraout_var;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__DeepTiledInputFile_03145058;
  pDVar2 = (Data *)operator_new(0x1e8);
  Data::Data(pDVar2,numThreads);
  this->_data = pDVar2;
  pDVar2->_streamData->is = is;
  pDVar2->_deleteStream = false;
  Header::operator=(&pDVar2->header,header);
  this->_data->version = version;
  initialize(this);
  pDVar2 = this->_data;
  TileOffsets::readFrom
            (&pDVar2->tileOffsets,pDVar2->_streamData->is,&pDVar2->fileIsComplete,false,true);
  iVar1 = (*is->_vptr_IStream[2])(is);
  pDVar2 = this->_data;
  pDVar2->memoryMapped = SUB41(iVar1,0);
  iVar1 = (*pDVar2->_streamData->is->_vptr_IStream[5])();
  this->_data->_streamData->currentPosition = CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

DeepTiledInputFile::DeepTiledInputFile (const Header &header,
                                        OPENEXR_IMF_INTERNAL_NAMESPACE::IStream *is,
                                        int version,
                                        int numThreads) :
    _data (new Data (numThreads))
    
{
    _data->_streamData->is = is;
    _data->_deleteStream=false;
    
    //
    // This constructor called by class Imf::InputFile
    // when a user wants to just read an image file, and
    // doesn't care or know if the file is tiled.
    // No need to have backward compatibility here, because
    // we have the header.
    //

    _data->header = header;
    _data->version = version;
    initialize();
    _data->tileOffsets.readFrom (*(_data->_streamData->is), _data->fileIsComplete,false,true);
    _data->memoryMapped = is->isMemoryMapped();
    _data->_streamData->currentPosition = _data->_streamData->is->tellg();
}